

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_return::run_impl(statement_return *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *peVar3;
  any *this_00;
  undefined1 in_stack_000008cf;
  iterator *in_stack_000008d0;
  runtime_type *in_stack_000008d8;
  string *in_stack_ffffffffffffff88;
  runtime_error *in_stack_ffffffffffffff90;
  stack_type<cs_impl::any,_std::allocator> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  cs_debugger_step_callback((statement_base *)in_stack_ffffffffffffffd0);
  bVar1 = stack_type<cs_impl::any,_std::allocator>::empty
                    ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f526b);
    peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f5277);
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)peVar3);
    runtime_type::parse_expr(in_stack_000008d8,in_stack_000008d0,(bool)in_stack_000008cf);
    this_00 = stack_type<cs_impl::any,_std::allocator>::top(in_stack_ffffffffffffffd0);
    cs_impl::any::operator=(this_00,(any *)peVar3);
    cs_impl::any::~any((any *)0x1f52d6);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f52e4);
    peVar3 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f52f0);
    peVar3->return_fcall = true;
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,"Return outside function.",(allocator *)&stack0xffffffffffffffd7);
  runtime_error::runtime_error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void statement_return::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (current_process->stack.empty())
			throw runtime_error("Return outside function.");
		current_process->stack.top() = context->instance->parse_expr(this->mTree.root());
		context->instance->return_fcall = true;
	}